

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::TraceConfig_ProducerConfig::ParseFromArray
          (TraceConfig_ProducerConfig *this,void *raw,size_t size)

{
  string *val;
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ushort uVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint *puVar16;
  ulong *puVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst;
  bool bVar18;
  ulong local_68;
  Field local_58;
  ulong *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  TraceConfig_ProducerConfig *local_38;
  
  dst = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar17 = (ulong *)(size + (long)raw);
  do {
    lVar7 = 7;
    if (puVar17 <= raw) goto LAB_0024b926;
    uVar10 = (ulong)(char)(byte)*raw;
    puVar9 = (ulong *)((long)raw + 1);
    if ((long)uVar10 < 0) {
      bVar1 = (byte)*raw;
      uVar3 = (ulong)(bVar1 & 0x7f);
      bVar8 = false;
      puVar11 = puVar9;
      for (lVar6 = lVar7;
          (puVar12 = puVar11, uVar10 = uVar3, (char)bVar1 < '\0' &&
          (bVar18 = 0x38 < lVar6 - 7U, bVar8 = bVar18 || puVar17 <= puVar11, size = (size_t)puVar11,
          puVar12 = puVar9, uVar10 = 0, !bVar18 && puVar17 > puVar11)); lVar6 = lVar6 + 7) {
        bVar1 = (byte)*puVar11;
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar3 = uVar3 | (ulong)(bVar1 & 0x7f) << ((byte)lVar6 & 0x3f);
        size = (size_t)puVar11;
      }
      puVar9 = puVar12;
      if (bVar8) {
        puVar9 = (ulong *)raw;
        uVar10 = 0;
      }
      if (puVar9 == (ulong *)raw) goto LAB_0024b926;
    }
    uVar2 = (uint)(uVar10 >> 3);
    if ((uVar2 == 0) || (puVar17 <= puVar9)) {
switchD_0024b7a0_caseD_3:
      bVar8 = false;
      uVar10 = 0;
      local_58.int_value_ = 0;
    }
    else {
      switch((uint)uVar10 & 7) {
      case 0:
        uVar13 = 0;
        bVar8 = puVar9 >= puVar17;
        if (puVar9 < puVar17) {
          size = (long)puVar9 + 1;
          uVar3 = (ulong)((byte)*puVar9 & 0x7f);
          uVar4 = uVar3;
          uVar15 = 0;
          if ((char)(byte)*puVar9 < '\0') {
            uVar4 = 0;
            uVar15 = 0;
            lVar7 = 7;
            puVar11 = (ulong *)size;
            do {
              bVar18 = 0x38 < lVar7 - 7U;
              bVar8 = bVar18 || puVar17 <= puVar11;
              if (bVar18 || puVar17 <= puVar11) goto LAB_0024b92d;
              uVar14 = *puVar11;
              puVar11 = (ulong *)((long)puVar11 + 1);
              uVar3 = uVar3 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar7 & 0x3f);
              lVar7 = lVar7 + 7;
            } while ((char)(byte)uVar14 < '\0');
            uVar4 = uVar3 & 0xffffffff;
            size = (size_t)puVar11;
            uVar15 = (uint)(uVar3 >> 0x20);
          }
        }
        else {
          uVar4 = 0;
          uVar15 = 0;
        }
LAB_0024b92d:
        uVar3 = (ulong)uVar15;
        if (bVar8) {
          size = (size_t)puVar9;
          uVar3 = uVar13;
          uVar4 = uVar13;
        }
        local_48 = (ulong *)raw;
        if ((ulong *)size != puVar9) goto LAB_0024b954;
        uVar10 = 0;
        bVar8 = false;
        local_58.int_value_ = uVar13;
        goto LAB_0024b996;
      case 1:
        size = (size_t)(puVar9 + 1);
        if (puVar17 < size) {
LAB_0024b926:
          uVar10 = 0;
          bVar8 = false;
          local_58.int_value_ = 0;
          goto LAB_0024b996;
        }
        uVar4 = *puVar9;
        uVar3 = uVar4 >> 0x20;
        break;
      case 2:
        bVar8 = puVar9 >= puVar17;
        uVar3 = local_68;
        if (puVar9 < puVar17) {
          bVar1 = (byte)*puVar9;
          uVar4 = (ulong)(bVar1 & 0x7f);
          puVar11 = (ulong *)((long)puVar9 + 1U);
          for (; (size = (size_t)puVar11, uVar3 = uVar4, (char)bVar1 < '\0' &&
                 (bVar18 = 0x38 < lVar7 - 7U, bVar8 = bVar18 || puVar17 <= puVar11,
                 size = (size_t)((long)puVar9 + 1U), uVar3 = local_68, !bVar18 && puVar17 > puVar11)
                 ); lVar7 = lVar7 + 7) {
            bVar1 = (byte)*puVar11;
            puVar11 = (ulong *)((long)puVar11 + 1);
            uVar4 = uVar4 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
          }
        }
        local_68 = uVar3;
        if (bVar8) {
          size = (size_t)puVar9;
          local_68 = 0;
        }
        if (((ulong *)size == puVar9) || ((long)puVar17 - size < local_68)) {
          uVar3 = 0;
          uVar4 = 0;
          bVar8 = false;
          uVar13 = 0;
        }
        else {
          uVar3 = size >> 0x20;
          uVar4 = size & 0xffffffff;
          size = size + local_68;
          bVar8 = true;
          uVar13 = local_68;
        }
        if (!bVar8) goto LAB_0024b926;
        goto LAB_0024b954;
      default:
        goto switchD_0024b7a0_caseD_3;
      case 5:
        size = (long)puVar9 + 4;
        uVar3 = 0;
        if (puVar17 < size) goto LAB_0024b926;
        uVar4 = (ulong)(uint)*puVar9;
      }
      uVar13 = 0;
LAB_0024b954:
      bVar8 = true;
      raw = (void *)size;
      if ((uVar2 < 0x10000) && (uVar13 < 0x10000000)) {
        local_58.int_value_ = uVar4 & 0xffffffff | uVar3 << 0x20;
        uVar10 = uVar13 | (uVar10 >> 3) << 0x20 | (ulong)((uint)uVar10 & 7) << 0x30;
        bVar8 = false;
      }
      else {
        local_58.int_value_ = 0;
        uVar10 = 0;
      }
    }
LAB_0024b996:
    uVar3 = 7;
    puVar16 = &switchD_0024b7a0::switchdataD_0034e278;
    if (!bVar8) {
      local_58.size_ = (uint32_t)uVar10;
      local_58.type_ = (uint8_t)(uVar10 >> 0x30);
      local_58.id_ = (uint16_t)(uVar10 >> 0x20);
      if (local_58.id_ != 0) {
        val = &this->producer_name_;
        local_40 = dst;
        local_38 = this;
        do {
          uVar5 = (ushort)(uVar10 >> 0x20);
          if (uVar5 < 4) {
            (this->_has_field_).super__Base_bitset<1UL>._M_w =
                 (this->_has_field_).super__Base_bitset<1UL>._M_w |
                 1L << ((byte)(uVar10 >> 0x20) & 0x3f);
          }
          if (uVar5 == 3) {
            this->page_size_kb_ = (uint32_t)local_58.int_value_;
          }
          else {
            uVar2 = (uint)(uVar10 >> 0x20) & 0xffff;
            if (uVar2 == 2) {
              this->shm_size_kb_ = (uint32_t)local_58.int_value_;
            }
            else if (uVar2 == 1) {
              protozero::Field::get(&local_58,val);
            }
            else {
              protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_58,dst);
            }
          }
          do {
            if (puVar17 <= raw) goto LAB_0024bb51;
            uVar10 = (ulong)(char)(byte)*raw;
            puVar9 = (ulong *)((long)raw + 1);
            if ((long)uVar10 < 0) {
              uVar4 = (ulong)((byte)*raw & 0x7f);
              bVar8 = false;
              uVar10 = uVar4;
              puVar11 = puVar9;
              if ((char)(byte)*raw < '\0') {
                lVar7 = 7;
                puVar12 = puVar9;
                do {
                  bVar8 = 0x38 < lVar7 - 7U || puVar17 <= puVar12;
                  uVar10 = 0;
                  puVar11 = puVar9;
                  if (bVar8) break;
                  uVar13 = *puVar12;
                  puVar11 = (ulong *)((long)puVar12 + 1);
                  uVar4 = uVar4 | (ulong)((byte)uVar13 & 0x7f) << ((byte)lVar7 & 0x3f);
                  lVar7 = lVar7 + 7;
                  uVar10 = uVar4;
                  puVar12 = puVar11;
                } while ((char)(byte)uVar13 < '\0');
              }
              puVar9 = puVar11;
              if (bVar8) {
                puVar9 = (ulong *)raw;
                uVar10 = 0;
              }
              if (puVar9 == (ulong *)raw) goto LAB_0024bb51;
            }
            uVar2 = (uint)(uVar10 >> 3);
            if ((uVar2 == 0) || (puVar17 <= puVar9)) {
switchD_0024bbd8_caseD_3:
              local_58.int_value_ = 0;
              bVar8 = false;
              uVar10 = 0;
              goto LAB_0024bde0;
            }
            switch((uint)uVar10 & 7) {
            case 0:
              local_58.int_value_ = 0;
              bVar8 = puVar9 >= puVar17;
              if (puVar9 < puVar17) {
                puVar11 = (ulong *)((long)puVar9 + 1);
                uVar15 = (byte)*puVar9 & 0x7f;
                uVar4 = (ulong)uVar15;
                uVar13 = (ulong)uVar15;
                puVar16 = (uint *)puVar11;
                uVar15 = 0;
                if ((char)(byte)*puVar9 < '\0') {
                  uVar13 = 0;
                  lVar7 = 7;
                  puVar12 = puVar11;
                  do {
                    bVar18 = 0x38 < lVar7 - 7U;
                    bVar8 = bVar18 || puVar17 <= puVar12;
                    puVar16 = (uint *)puVar11;
                    uVar15 = 0;
                    if (bVar18 || puVar17 <= puVar12) break;
                    bVar1 = (byte)*puVar12;
                    puVar12 = (ulong *)((long)puVar12 + 1);
                    uVar4 = uVar4 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
                    lVar7 = lVar7 + 7;
                    if (-1 < (char)bVar1) {
                      uVar13 = uVar4 & 0xffffffff;
                    }
                    puVar16 = (uint *)puVar12;
                    uVar15 = (uint)(uVar4 >> 0x20);
                  } while (-1 >= (char)bVar1);
                }
              }
              else {
                uVar13 = 0;
                uVar15 = 0;
              }
              if (bVar8) {
                uVar13 = local_58.int_value_;
              }
              uVar4 = (ulong)uVar15;
              if (bVar8) {
                puVar16 = (uint *)puVar9;
                uVar4 = local_58.int_value_;
              }
              this = local_38;
              uVar14 = local_58.int_value_;
              dst = local_40;
              local_48 = (ulong *)raw;
              if ((ulong *)puVar16 == puVar9) {
                uVar10 = 0;
                bVar8 = false;
              }
              else {
LAB_0024bd95:
                bVar8 = true;
                raw = puVar16;
                if ((uVar2 < 0x10000) && (uVar14 < 0x10000000)) {
                  local_58.int_value_ = uVar13 & 0xffffffff | uVar4 << 0x20;
                  uVar10 = uVar14 | (uVar10 >> 3) << 0x20 | (uVar10 & 7) << 0x30;
                  bVar8 = false;
                }
                else {
                  local_58.int_value_ = 0;
                  uVar10 = 0;
                }
              }
              break;
            case 1:
              puVar16 = (uint *)(puVar9 + 1);
              if (puVar16 <= puVar17) {
                uVar13 = *puVar9;
                uVar4 = uVar13 >> 0x20;
LAB_0024bc3c:
                uVar14 = 0;
                goto LAB_0024bd95;
              }
              goto LAB_0024bb51;
            case 2:
              bVar8 = puVar9 >= puVar17;
              uVar4 = uVar3;
              if (puVar9 < puVar17) {
                puVar11 = (ulong *)((long)puVar9 + 1);
                uVar13 = (ulong)((byte)*puVar9 & 0x7f);
                uVar4 = uVar13;
                puVar16 = (uint *)puVar11;
                if ((char)(byte)*puVar9 < '\0') {
                  lVar7 = 7;
                  puVar12 = puVar11;
                  do {
                    bVar8 = 0x38 < lVar7 - 7U || puVar17 <= puVar12;
                    uVar4 = uVar3;
                    puVar16 = (uint *)puVar11;
                    if (bVar8) break;
                    uVar14 = *puVar12;
                    puVar12 = (ulong *)((long)puVar12 + 1);
                    uVar13 = uVar13 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar7 & 0x3f);
                    lVar7 = lVar7 + 7;
                    uVar4 = uVar13;
                    puVar16 = (uint *)puVar12;
                  } while ((char)(byte)uVar14 < '\0');
                }
              }
              uVar3 = uVar4;
              if (bVar8) {
                puVar16 = (uint *)puVar9;
                uVar3 = 0;
              }
              if (((ulong *)puVar16 == puVar9) || ((ulong)((long)puVar17 - (long)puVar16) < uVar3))
              {
                uVar13 = 0;
                uVar4 = 0;
                bVar8 = false;
                uVar14 = 0;
              }
              else {
                uVar4 = (ulong)puVar16 >> 0x20;
                uVar13 = (ulong)puVar16 & 0xffffffff;
                puVar16 = (uint *)((long)puVar16 + uVar3);
                bVar8 = true;
                uVar14 = uVar3;
              }
              if (bVar8) goto LAB_0024bd95;
              local_58.int_value_ = 0;
              uVar10 = 0;
              bVar8 = false;
              break;
            default:
              goto switchD_0024bbd8_caseD_3;
            case 5:
              puVar16 = (uint *)((long)puVar9 + 4);
              uVar4 = 0;
              if (puVar16 <= puVar17) {
                uVar13 = (ulong)(uint)*puVar9;
                goto LAB_0024bc3c;
              }
LAB_0024bb51:
              local_58.int_value_ = 0;
              uVar10 = 0;
              bVar8 = false;
            }
LAB_0024bde0:
          } while (bVar8);
          local_58.size_ = (uint32_t)uVar10;
          local_58.type_ = (uint8_t)(uVar10 >> 0x30);
          local_58.id_ = (uint16_t)(uVar10 >> 0x20);
        } while (local_58.id_ != 0);
      }
      return puVar17 == (ulong *)raw;
    }
  } while( true );
}

Assistant:

bool TraceConfig_ProducerConfig::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* producer_name */:
        field.get(&producer_name_);
        break;
      case 2 /* shm_size_kb */:
        field.get(&shm_size_kb_);
        break;
      case 3 /* page_size_kb */:
        field.get(&page_size_kb_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}